

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase29::run(TestCase29 *this)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  ArrayPtr<const_char> *in_RCX;
  ArrayPtr<const_char> *pAVar6;
  ArrayPtr<const_char> *pAVar7;
  char *pcVar8;
  longlong *plVar9;
  char (*extraout_RDX) [4];
  char (*extraout_RDX_00) [4];
  char (*extraout_RDX_01) [4];
  char (*extraout_RDX_02) [4];
  char (*extraout_RDX_03) [4];
  char (*extraout_RDX_04) [4];
  char (*extraout_RDX_05) [4];
  char (*extraout_RDX_06) [4];
  char (*extraout_RDX_07) [4];
  char (*params) [4];
  ArrayDisposer *pAVar10;
  char (*extraout_RDX_08) [4];
  char (*extraout_RDX_09) [4];
  char (*extraout_RDX_10) [4];
  char (*params_00) [4];
  char (*extraout_RDX_11) [4];
  char (*extraout_RDX_12) [4];
  char (*extraout_RDX_13) [4];
  char (*extraout_RDX_14) [4];
  char (*extraout_RDX_15) [4];
  char (*extraout_RDX_16) [4];
  char (*pacVar11) [4];
  char (*params_01) [4];
  char *pcVar12;
  StringTree *this_00;
  long lVar13;
  ArrayDisposer *pAVar14;
  longlong *in_stack_fffffffffffffef8;
  longlong *plVar15;
  ArrayPtr<const_char> *pAStack_100;
  ArrayDisposer *local_f8;
  DebugComparison<const_char_(&)[10],_kj::String> _kjCondition_4;
  uint pieceCount;
  undefined4 uStack_ac;
  undefined1 local_a8 [28];
  undefined1 local_8c [4];
  undefined1 local_88 [24];
  DebugComparison<const_char_(&)[7],_kj::String> _kjCondition;
  undefined4 local_34;
  
  pAVar6 = pAStack_100;
  local_a8._0_8_ = "foobar";
  strTree<char_const(&)[4],char_const(&)[4]>
            ((StringTree *)&_kjCondition_4,(kj *)0x4d8ac4,(char (*) [4])0x4b858f,
             (char (*) [4])in_RCX);
  StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition_4);
  DebugExpression<char_const(&)[7]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[7]> *)local_a8,
             (String *)&stack0xfffffffffffffef8);
  plVar15 = in_stack_fffffffffffffef8;
  if (in_stack_fffffffffffffef8 != (longlong *)0x0) {
    plVar15 = (longlong *)0x0;
    pAStack_100 = (ArrayPtr<const_char> *)0x0;
    (**local_f8->_vptr_ArrayDisposer)(local_f8,in_stack_fffffffffffffef8,1,pAVar6,pAVar6,0);
    in_RCX = pAVar6;
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition_4.op.content.size_;
  pcVar12 = _kjCondition_4.op.content.ptr;
  pAVar6 = pAStack_100;
  if (_kjCondition_4.op.content.ptr != (char *)0x0) {
    _kjCondition_4.op.content.ptr = (char *)0x0;
    _kjCondition_4.op.content.size_ = 0;
    (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
              ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar12,0x40,
               pAVar7,pAVar7,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    in_RCX = pAVar7;
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition_4.right.content.size_;
  pcVar12 = _kjCondition_4.right.content.ptr;
  if (_kjCondition_4.right.content.ptr != (char *)0x0) {
    _kjCondition_4.right.content.ptr = (char *)0x0;
    _kjCondition_4.right.content.size_ = 0;
    (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition_4.right.content.disposer,pcVar12,1,pAVar7,pAVar7,0);
    in_RCX = pAVar7;
  }
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    strTree<char_const(&)[4],char_const(&)[4]>
              ((StringTree *)&_kjCondition_4,(kj *)0x4d8ac4,(char (*) [4])0x4b858f,
               (char (*) [4])in_RCX);
    StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition_4);
    Debug::
    log<char_const(&)[65],kj::_::DebugComparison<char_const(&)[7],kj::String>&,char_const(&)[7],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x1e,ERROR,
               "\"failed: expected \" \"(\\\"foobar\\\") == (strTree(\\\"foo\\\", \\\"bar\\\").flatten())\", _kjCondition, \"foobar\", strTree(\"foo\", \"bar\").flatten()"
               ,(char (*) [65])
                "failed: expected (\"foobar\") == (strTree(\"foo\", \"bar\").flatten())",
               &_kjCondition,(char (*) [7])0x4d937d,(String *)&stack0xfffffffffffffef8);
    if (plVar15 != (longlong *)0x0) {
      plVar9 = (longlong *)0x0;
      pAStack_100 = (ArrayPtr<const_char> *)0x0;
      (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar15,1,pAVar6,pAVar6,0);
      plVar15 = plVar9;
    }
    sVar2 = _kjCondition_4.op.content.size_;
    pcVar12 = _kjCondition_4.op.content.ptr;
    if (_kjCondition_4.op.content.ptr != (char *)0x0) {
      _kjCondition_4.op.content.ptr = (char *)0x0;
      _kjCondition_4.op.content.size_ = 0;
      (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
                ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar12,0x40,
                 sVar2,sVar2,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = _kjCondition_4.right.content.size_;
    pcVar12 = _kjCondition_4.right.content.ptr;
    if (_kjCondition_4.right.content.ptr != (char *)0x0) {
      _kjCondition_4.right.content.ptr = (char *)0x0;
      _kjCondition_4.right.content.size_ = 0;
      (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
                (_kjCondition_4.right.content.disposer,pcVar12,1,sVar2,sVar2,0);
    }
  }
  sVar2 = _kjCondition.right.content.size_;
  pcVar12 = _kjCondition.right.content.ptr;
  pAVar6 = pAStack_100;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar12,1,sVar2,sVar2,0);
  }
  local_a8._0_8_ = "1 2 3 4";
  local_8c[0] = '\x01';
  local_8c[1] = '\0';
  local_8c[2] = '\0';
  local_8c[3] = '\0';
  local_34 = 2;
  local_88._0_8_ = (Branch *)0x3;
  _pieceCount = (char *)0x4;
  strTree<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
            ((StringTree *)&_kjCondition_4,(kj *)local_8c,(int *)0x501fc6,
             (char (*) [2])&stack0xffffffffffffffcc,(uint *)0x501fc6,(char (*) [2])local_88,
             (long *)0x501fc6,(char (*) [2])&pieceCount,plVar15);
  StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition_4);
  DebugExpression<char_const(&)[8]>::operator==
            ((DebugComparison<const_char_(&)[8],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[8]> *)local_a8,(String *)&stack0xfffffffffffffef8);
  plVar9 = plVar15;
  if (plVar15 != (longlong *)0x0) {
    plVar9 = (longlong *)0x0;
    pAStack_100 = (ArrayPtr<const_char> *)0x0;
    (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar15,1,pAVar6,pAVar6,0);
  }
  sVar2 = _kjCondition_4.op.content.size_;
  pcVar12 = _kjCondition_4.op.content.ptr;
  pAVar6 = pAStack_100;
  if (_kjCondition_4.op.content.ptr != (char *)0x0) {
    _kjCondition_4.op.content.ptr = (char *)0x0;
    _kjCondition_4.op.content.size_ = 0;
    (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
              ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar12,0x40,
               sVar2,sVar2,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = _kjCondition_4.right.content.size_;
  pcVar12 = _kjCondition_4.right.content.ptr;
  if (_kjCondition_4.right.content.ptr != (char *)0x0) {
    _kjCondition_4.right.content.ptr = (char *)0x0;
    _kjCondition_4.right.content.size_ = 0;
    (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition_4.right.content.disposer,pcVar12,1,sVar2,sVar2,0);
  }
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    _pieceCount = (char *)CONCAT44(uStack_ac,1);
    local_8c[0] = '\x02';
    local_8c[1] = '\0';
    local_8c[2] = '\0';
    local_8c[3] = '\0';
    local_a8._0_8_ = (uint *)0x3;
    local_88._0_8_ = &DAT_00000004;
    strTree<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
              ((StringTree *)&_kjCondition_4,(kj *)&pieceCount,(int *)0x501fc6,
               (char (*) [2])local_8c,(uint *)0x501fc6,(char (*) [2])local_a8,(long *)0x501fc6,
               (char (*) [2])local_88,plVar9);
    StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition_4);
    Debug::
    log<char_const(&)[83],kj::_::DebugComparison<char_const(&)[8],kj::String>&,char_const(&)[8],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x1f,ERROR,
               "\"failed: expected \" \"(\\\"1 2 3 4\\\") == (strTree(1, \\\" \\\", 2u, \\\" \\\", 3l, \\\" \\\", 4ll).flatten())\", _kjCondition, \"1 2 3 4\", strTree(1, \" \", 2u, \" \", 3l, \" \", 4ll).flatten()"
               ,(char (*) [83])
                "failed: expected (\"1 2 3 4\") == (strTree(1, \" \", 2u, \" \", 3l, \" \", 4ll).flatten())"
               ,(DebugComparison<const_char_(&)[8],_kj::String> *)&_kjCondition,
               (char (*) [8])"1 2 3 4",(String *)&stack0xfffffffffffffef8);
    if (plVar9 != (longlong *)0x0) {
      plVar15 = (longlong *)0x0;
      pAStack_100 = (ArrayPtr<const_char> *)0x0;
      (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar9,1,pAVar6,pAVar6,0);
      plVar9 = plVar15;
    }
    sVar2 = _kjCondition_4.op.content.size_;
    pcVar12 = _kjCondition_4.op.content.ptr;
    if (_kjCondition_4.op.content.ptr != (char *)0x0) {
      _kjCondition_4.op.content.ptr = (char *)0x0;
      _kjCondition_4.op.content.size_ = 0;
      (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
                ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar12,0x40,
                 sVar2,sVar2,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = _kjCondition_4.right.content.size_;
    pcVar12 = _kjCondition_4.right.content.ptr;
    if (_kjCondition_4.right.content.ptr != (char *)0x0) {
      _kjCondition_4.right.content.ptr = (char *)0x0;
      _kjCondition_4.right.content.size_ = 0;
      (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
                (_kjCondition_4.right.content.disposer,pcVar12,1,sVar2,sVar2,0);
    }
  }
  sVar2 = _kjCondition.right.content.size_;
  pcVar12 = _kjCondition.right.content.ptr;
  pAVar6 = pAStack_100;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar12,1,sVar2,sVar2,0);
  }
  local_a8._0_8_ = "1.5 foo 1e15 bar -3";
  _pieceCount = (char *)CONCAT44(uStack_ac,0x3fc00000);
  local_88._0_8_ = (Branch *)0x430c6bf526340000;
  local_8c[0] = -3;
  local_8c[1] = -1;
  local_8c[2] = -1;
  local_8c[3] = -1;
  pcVar12 = " bar ";
  strTree<float,char_const(&)[6],double,char_const(&)[6],int>
            ((StringTree *)&_kjCondition_4,(kj *)&pieceCount,(float *)" foo ",(char (*) [6])local_88
             ,(double *)" bar ",(char (*) [6])local_8c,(int *)plVar9);
  StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition_4);
  DebugExpression<char_const(&)[20]>::operator==
            ((DebugComparison<const_char_(&)[20],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[20]> *)local_a8,(String *)&stack0xfffffffffffffef8);
  plVar15 = plVar9;
  if (plVar9 != (longlong *)0x0) {
    plVar15 = (longlong *)0x0;
    pAStack_100 = (ArrayPtr<const_char> *)0x0;
    (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar9,1,pAVar6,pAVar6,0);
    pcVar12 = (char *)pAVar6;
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition_4.op.content.size_;
  pcVar8 = _kjCondition_4.op.content.ptr;
  pAVar6 = pAStack_100;
  if (_kjCondition_4.op.content.ptr != (char *)0x0) {
    _kjCondition_4.op.content.ptr = (char *)0x0;
    _kjCondition_4.op.content.size_ = 0;
    (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
              ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar8,0x40,
               pAVar7,pAVar7,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    pcVar12 = (char *)pAVar7;
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition_4.right.content.size_;
  pcVar8 = _kjCondition_4.right.content.ptr;
  if (_kjCondition_4.right.content.ptr != (char *)0x0) {
    _kjCondition_4.right.content.ptr = (char *)0x0;
    _kjCondition_4.right.content.size_ = 0;
    (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition_4.right.content.disposer,pcVar8,1,pAVar7,pAVar7,0);
    pcVar12 = (char *)pAVar7;
  }
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    local_88._0_4_ = 0x3fc00000;
    local_a8._0_8_ = (uint *)0x430c6bf526340000;
    _pieceCount = (char *)CONCAT44(uStack_ac,0xfffffffd);
    strTree<float,char_const(&)[6],double,char_const(&)[6],int>
              ((StringTree *)&_kjCondition_4,(kj *)local_88,(float *)" foo ",(char (*) [6])local_a8,
               (double *)" bar ",(char (*) [6])&pieceCount,(int *)plVar15);
    StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition_4);
    pcVar12 = 
    "failed: expected (\"1.5 foo 1e15 bar -3\") == (strTree(1.5f, \" foo \", 1e15, \" bar \", -3).flatten())"
    ;
    Debug::
    log<char_const(&)[98],kj::_::DebugComparison<char_const(&)[20],kj::String>&,char_const(&)[20],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x20,ERROR,
               "\"failed: expected \" \"(\\\"1.5 foo 1e15 bar -3\\\") == (strTree(1.5f, \\\" foo \\\", 1e15, \\\" bar \\\", -3).flatten())\", _kjCondition, \"1.5 foo 1e15 bar -3\", strTree(1.5f, \" foo \", 1e15, \" bar \", -3).flatten()"
               ,(char (*) [98])
                "failed: expected (\"1.5 foo 1e15 bar -3\") == (strTree(1.5f, \" foo \", 1e15, \" bar \", -3).flatten())"
               ,(DebugComparison<const_char_(&)[20],_kj::String> *)&_kjCondition,
               (char (*) [20])"1.5 foo 1e15 bar -3",(String *)&stack0xfffffffffffffef8);
    if (plVar15 != (longlong *)0x0) {
      plVar9 = (longlong *)0x0;
      pAStack_100 = (ArrayPtr<const_char> *)0x0;
      (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar15,1,pAVar6,pAVar6,0);
      pcVar12 = (char *)pAVar6;
      plVar15 = plVar9;
    }
    pAVar6 = (ArrayPtr<const_char> *)_kjCondition_4.op.content.size_;
    pcVar8 = _kjCondition_4.op.content.ptr;
    if (_kjCondition_4.op.content.ptr != (char *)0x0) {
      _kjCondition_4.op.content.ptr = (char *)0x0;
      _kjCondition_4.op.content.size_ = 0;
      (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
                ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar8,0x40,
                 pAVar6,pAVar6,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
      pcVar12 = (char *)pAVar6;
    }
    pAVar6 = (ArrayPtr<const_char> *)_kjCondition_4.right.content.size_;
    pcVar8 = _kjCondition_4.right.content.ptr;
    if (_kjCondition_4.right.content.ptr != (char *)0x0) {
      _kjCondition_4.right.content.ptr = (char *)0x0;
      _kjCondition_4.right.content.size_ = 0;
      (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
                (_kjCondition_4.right.content.disposer,pcVar8,1,pAVar6,pAVar6,0);
      pcVar12 = (char *)pAVar6;
    }
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition.right.content.size_;
  pcVar8 = _kjCondition.right.content.ptr;
  pAVar6 = pAStack_100;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar8,1,pAVar7,pAVar7,0);
    pcVar12 = (char *)pAVar7;
  }
  local_a8._0_8_ = "foo";
  local_88[0] = 0x66;
  _pieceCount = (char *)CONCAT71(stack0xffffffffffffff51,0x6f);
  pcVar8 = local_8c;
  local_8c[0] = 'o';
  StringTree::concat<kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>>
            ((StringTree *)&_kjCondition_4,(StringTree *)local_88,
             (FixedArray<char,_1UL> *)&pieceCount,(FixedArray<char,_1UL> *)pcVar8,
             (FixedArray<char,_1UL> *)pcVar12);
  StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition_4);
  DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)local_a8,(String *)&stack0xfffffffffffffef8);
  pacVar11 = extraout_RDX;
  plVar9 = plVar15;
  if (plVar15 != (longlong *)0x0) {
    plVar9 = (longlong *)0x0;
    pAStack_100 = (ArrayPtr<const_char> *)0x0;
    pcVar12 = (char *)pAVar6;
    (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar15,1,pAVar6,pAVar6,0);
    pcVar8 = (char *)pAVar6;
    pacVar11 = extraout_RDX_00;
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition_4.op.content.size_;
  pcVar1 = _kjCondition_4.op.content.ptr;
  pAVar6 = pAStack_100;
  if (_kjCondition_4.op.content.ptr != (char *)0x0) {
    _kjCondition_4.op.content.ptr = (char *)0x0;
    _kjCondition_4.op.content.size_ = 0;
    pcVar12 = (char *)pAVar7;
    (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
              ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar1,0x40,
               pAVar7,pAVar7,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    pcVar8 = (char *)pAVar7;
    pacVar11 = extraout_RDX_01;
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition_4.right.content.size_;
  pcVar1 = _kjCondition_4.right.content.ptr;
  if (_kjCondition_4.right.content.ptr != (char *)0x0) {
    _kjCondition_4.right.content.ptr = (char *)0x0;
    _kjCondition_4.right.content.size_ = 0;
    pcVar12 = (char *)pAVar7;
    (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition_4.right.content.disposer,pcVar1,1,pAVar7,pAVar7,0);
    pcVar8 = (char *)pAVar7;
    pacVar11 = extraout_RDX_02;
  }
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    local_a8[0] = 0x66;
    local_88[0] = 0x6f;
    _pieceCount = (char *)CONCAT71(stack0xffffffffffffff51,0x6f);
    StringTree::concat<kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>>
              ((StringTree *)&_kjCondition_4,(StringTree *)local_a8,
               (FixedArray<char,_1UL> *)local_88,(FixedArray<char,_1UL> *)&pieceCount,
               (FixedArray<char,_1UL> *)pcVar12);
    StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition_4);
    pcVar8 = 
    "\"failed: expected \" \"(\\\"foo\\\") == (strTree(\'f\', \'o\', \'o\').flatten())\", _kjCondition, \"foo\", strTree(\'f\', \'o\', \'o\').flatten()"
    ;
    pcVar12 = "failed: expected (\"foo\") == (strTree(\'f\', \'o\', \'o\').flatten())";
    Debug::
    log<char_const(&)[63],kj::_::DebugComparison<char_const(&)[4],kj::String>&,char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x21,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (strTree(\'f\', \'o\', \'o\').flatten())\", _kjCondition, \"foo\", strTree(\'f\', \'o\', \'o\').flatten()"
               ,(char (*) [63])
                "failed: expected (\"foo\") == (strTree(\'f\', \'o\', \'o\').flatten())",
               (DebugComparison<const_char_(&)[4],_kj::String> *)&_kjCondition,
               (char (*) [4])0x4d8ac4,(String *)&stack0xfffffffffffffef8);
    pacVar11 = extraout_RDX_03;
    if (plVar9 != (longlong *)0x0) {
      plVar15 = (longlong *)0x0;
      pAStack_100 = (ArrayPtr<const_char> *)0x0;
      pcVar12 = (char *)pAVar6;
      (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar9,1,pAVar6,pAVar6,0);
      pcVar8 = (char *)pAVar6;
      pacVar11 = extraout_RDX_04;
      plVar9 = plVar15;
    }
    pAVar6 = (ArrayPtr<const_char> *)_kjCondition_4.op.content.size_;
    pcVar1 = _kjCondition_4.op.content.ptr;
    if (_kjCondition_4.op.content.ptr != (char *)0x0) {
      _kjCondition_4.op.content.ptr = (char *)0x0;
      _kjCondition_4.op.content.size_ = 0;
      pcVar12 = (char *)pAVar6;
      (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
                ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar1,0x40,
                 pAVar6,pAVar6,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
      pcVar8 = (char *)pAVar6;
      pacVar11 = extraout_RDX_05;
    }
    pAVar6 = (ArrayPtr<const_char> *)_kjCondition_4.right.content.size_;
    pcVar1 = _kjCondition_4.right.content.ptr;
    if (_kjCondition_4.right.content.ptr != (char *)0x0) {
      _kjCondition_4.right.content.ptr = (char *)0x0;
      _kjCondition_4.right.content.size_ = 0;
      pcVar12 = (char *)pAVar6;
      (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
                (_kjCondition_4.right.content.disposer,pcVar1,1,pAVar6,pAVar6,0);
      pcVar8 = (char *)pAVar6;
      pacVar11 = extraout_RDX_06;
    }
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition.right.content.size_;
  pcVar1 = _kjCondition.right.content.ptr;
  pAVar6 = pAStack_100;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    pcVar12 = (char *)pAVar7;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar1,1,pAVar7,pAVar7,0);
    pcVar8 = (char *)pAVar7;
    pacVar11 = extraout_RDX_07;
  }
  str<char_const(&)[4]>((String *)&stack0xfffffffffffffef8,(kj *)0x4d8ac4,pacVar11);
  str<char_const(&)[4]>((String *)local_a8,(kj *)0x4b858f,params);
  strTree<kj::String,kj::String>
            ((StringTree *)&_kjCondition_4,(kj *)&stack0xfffffffffffffef8,(String *)local_a8,
             (String *)pcVar8);
  local_88._0_8_ = "baz";
  local_88._8_8_ = (ArrayPtr<const_char> *)0x3;
  StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            ((StringTree *)&_kjCondition,(StringTree *)&_kjCondition_4,(StringTree *)local_88,
             (ArrayPtr<const_char> *)pcVar8);
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition_4.op.content.size_;
  pcVar8 = _kjCondition_4.op.content.ptr;
  if (_kjCondition_4.op.content.ptr != (char *)0x0) {
    _kjCondition_4.op.content.ptr = (char *)0x0;
    _kjCondition_4.op.content.size_ = 0;
    (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
              ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar8,0x40,
               pAVar7,pAVar7,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    pcVar12 = (char *)pAVar7;
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition_4.right.content.size_;
  pcVar8 = _kjCondition_4.right.content.ptr;
  if (_kjCondition_4.right.content.ptr != (char *)0x0) {
    _kjCondition_4.right.content.ptr = (char *)0x0;
    _kjCondition_4.right.content.size_ = 0;
    (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition_4.right.content.disposer,pcVar8,1,pAVar7,pAVar7,0);
    pcVar12 = (char *)pAVar7;
  }
  pAVar7 = (ArrayPtr<const_char> *)local_a8._8_8_;
  uVar3 = local_a8._0_8_;
  if ((uint *)local_a8._0_8_ != (uint *)0x0) {
    local_a8._0_8_ = (uint *)0x0;
    local_a8._8_8_ = (ArrayPtr<const_char> *)0x0;
    (***(_func_int ***)local_a8._16_8_)(local_a8._16_8_,uVar3,1,pAVar7,pAVar7,0);
    pcVar12 = (char *)pAVar7;
  }
  plVar15 = plVar9;
  if (plVar9 != (longlong *)0x0) {
    plVar15 = (longlong *)0x0;
    pAStack_100 = (ArrayPtr<const_char> *)0x0;
    (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar9,1,pAVar6,pAVar6,0);
    pcVar12 = (char *)pAVar6;
  }
  pAVar6 = pAStack_100;
  local_a8._0_8_ = "foobarbaz";
  StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition);
  DebugExpression<char_const(&)[10]>::operator==
            (&_kjCondition_4,(DebugExpression<char_const(&)[10]> *)local_a8,
             (String *)&stack0xfffffffffffffef8);
  plVar9 = plVar15;
  if (plVar15 != (longlong *)0x0) {
    plVar9 = (longlong *)0x0;
    pAStack_100 = (ArrayPtr<const_char> *)0x0;
    (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar15,1,pAVar6,pAVar6,0);
    pcVar12 = (char *)pAVar6;
  }
  pAVar6 = pAStack_100;
  plVar15 = plVar9;
  if ((_kjCondition_4.result == false) && (Debug::minSeverity < 3)) {
    StringTree::flatten((String *)&stack0xfffffffffffffef8,(StringTree *)&_kjCondition);
    pcVar12 = "failed: expected (\"foobarbaz\") == (tree.flatten())";
    Debug::
    log<char_const(&)[51],kj::_::DebugComparison<char_const(&)[10],kj::String>&,char_const(&)[10],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x25,ERROR,
               "\"failed: expected \" \"(\\\"foobarbaz\\\") == (tree.flatten())\", _kjCondition, \"foobarbaz\", tree.flatten()"
               ,(char (*) [51])"failed: expected (\"foobarbaz\") == (tree.flatten())",
               &_kjCondition_4,(char (*) [10])0x4d13d4,(String *)&stack0xfffffffffffffef8);
    plVar15 = plVar9;
    if (plVar9 != (longlong *)0x0) {
      plVar15 = (longlong *)0x0;
      pAStack_100 = (ArrayPtr<const_char> *)0x0;
      (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar9,1,pAVar6,pAVar6,0);
      pcVar12 = (char *)pAVar6;
    }
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition_4.right.content.size_;
  pcVar8 = _kjCondition_4.right.content.ptr;
  pAVar6 = pAStack_100;
  if (_kjCondition_4.right.content.ptr != (char *)0x0) {
    _kjCondition_4.right.content.ptr = (char *)0x0;
    _kjCondition_4.right.content.size_ = 0;
    (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition_4.right.content.disposer,pcVar8,1,pAVar7,pAVar7,0);
    pcVar12 = (char *)pAVar7;
  }
  _pieceCount = (char *)((ulong)_pieceCount & 0xffffffff00000000);
  local_a8._0_8_ = (FixedArray<char,_1UL> *)&pieceCount;
  if (_kjCondition.op.content.size_ == 0) {
    uVar5 = 0;
    pAVar14 = (ArrayDisposer *)0x0;
  }
  else {
    this_00 = (StringTree *)(_kjCondition.op.content.ptr + 8);
    lVar13 = _kjCondition.op.content.size_ << 6;
    pAVar14 = (ArrayDisposer *)0x0;
    do {
      pAVar10 = this_00[-1].branches.disposer;
      plVar9 = (longlong *)((long)pAVar10 - (long)pAVar14);
      if (pAVar14 <= pAVar10 && plVar9 != (longlong *)0x0) {
        _pieceCount = (char *)CONCAT44(uStack_ac,pieceCount + 1);
        _kjCondition_4.left._0_4_ = 3;
        _kjCondition_4.right.content.size_ = (size_t)anon_var_dwarf_4cea5;
        _kjCondition_4.right.content.disposer = (ArrayDisposer *)&DAT_00000005;
        _kjCondition_4.op.content.ptr =
             (char *)CONCAT71(_kjCondition_4.op.content.ptr._1_7_,plVar9 == (longlong *)0x3);
        pAVar14 = pAVar10;
        _kjCondition_4.right.content.ptr = (char *)plVar9;
        if ((plVar9 != (longlong *)0x3) && (Debug::minSeverity < 3)) {
          local_88._0_4_ = 3;
          pcVar12 = "failed: expected (3u) == (part.size())";
          Debug::
          log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                     ,0x28,ERROR,
                     "\"failed: expected \" \"(3u) == (part.size())\", _kjCondition, 3u, part.size()"
                     ,(char (*) [39])"failed: expected (3u) == (part.size())",
                     (DebugComparison<unsigned_int,_unsigned_long> *)&_kjCondition_4,
                     (uint *)local_88,(unsigned_long *)&stack0xfffffffffffffef8);
          pAVar14 = this_00[-1].branches.disposer;
          plVar15 = plVar9;
        }
      }
      StringTree::visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>
                (this_00,(anon_class_8_1_6ec8c47f *)local_a8);
      this_00 = (StringTree *)&this_00[1].text;
      lVar13 = lVar13 + -0x40;
    } while (lVar13 != 0);
    uVar5 = pieceCount;
  }
  pAVar10 = (ArrayDisposer *)0x0;
  if (_kjCondition.right.content.size_ != 0) {
    pAVar10 = (ArrayDisposer *)(_kjCondition.right.content.size_ - 1);
  }
  plVar9 = (longlong *)((long)pAVar10 - (long)pAVar14);
  if (pAVar14 <= pAVar10 && plVar9 != (longlong *)0x0) {
    _pieceCount = (char *)CONCAT44(uStack_ac,uVar5 + 1);
    _kjCondition_4.left._0_4_ = 3;
    _kjCondition_4.right.content.size_ = (size_t)anon_var_dwarf_4cea5;
    _kjCondition_4.right.content.disposer = (ArrayDisposer *)&DAT_00000005;
    _kjCondition_4.op.content.ptr =
         (char *)CONCAT71(_kjCondition_4.op.content.ptr._1_7_,plVar9 == (longlong *)0x3);
    uVar5 = uVar5 + 1;
    if (Debug::minSeverity < 3 && plVar9 != (longlong *)0x3) {
      local_88._0_4_ = 3;
      pcVar12 = "failed: expected (3u) == (part.size())";
      _kjCondition_4.right.content.ptr = (char *)plVar9;
      Debug::
      log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
                 ,0x28,ERROR,
                 "\"failed: expected \" \"(3u) == (part.size())\", _kjCondition, 3u, part.size()",
                 (char (*) [39])"failed: expected (3u) == (part.size())",
                 (DebugComparison<unsigned_int,_unsigned_long> *)&_kjCondition_4,(uint *)local_88,
                 (unsigned_long *)&stack0xfffffffffffffef8);
      uVar5 = pieceCount;
      plVar15 = plVar9;
    }
  }
  _kjCondition_4.left._0_4_ = 3;
  _kjCondition_4.right.content.ptr = (char *)&pieceCount;
  pcVar8 = " == ";
  _kjCondition_4.right.content.size_ = (size_t)anon_var_dwarf_4cea5;
  _kjCondition_4.right.content.disposer = (ArrayDisposer *)&DAT_00000005;
  _kjCondition_4.op.content.ptr = (char *)CONCAT71(_kjCondition_4.op.content.ptr._1_7_,uVar5 == 3);
  if ((uVar5 != 3) && (Debug::minSeverity < 3)) {
    plVar15 = (longlong *)CONCAT44((int)((ulong)plVar15 >> 0x20),3);
    pcVar12 = "failed: expected (3u) == (pieceCount)";
    Debug::
    log<char_const(&)[38],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x29,ERROR,
               "\"failed: expected \" \"(3u) == (pieceCount)\", _kjCondition, 3u, pieceCount",
               (char (*) [38])"failed: expected (3u) == (pieceCount)",
               (DebugComparison<unsigned_int,_unsigned_int_&> *)&_kjCondition_4,
               (uint *)&stack0xfffffffffffffef8,&pieceCount);
    pcVar8 = *extraout_RDX_08;
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition.op.content.size_;
  pcVar1 = _kjCondition.op.content.ptr;
  if (_kjCondition.op.content.ptr != (char *)0x0) {
    _kjCondition.op.content.ptr = (char *)0x0;
    _kjCondition.op.content.size_ = 0;
    (*(code *)**(undefined8 **)CONCAT71(_kjCondition._49_7_,_kjCondition.result))
              ((undefined8 *)CONCAT71(_kjCondition._49_7_,_kjCondition.result),pcVar1,0x40,pAVar7,
               pAVar7,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    pcVar8 = *extraout_RDX_09;
    pcVar12 = (char *)pAVar7;
  }
  pAVar7 = (ArrayPtr<const_char> *)_kjCondition.right.content.size_;
  pcVar1 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar1,1,pAVar7,pAVar7,0);
    pcVar8 = *extraout_RDX_10;
    pcVar12 = (char *)pAVar7;
  }
  _pieceCount = "<foobarbaz>";
  str<char_const(&)[4]>((String *)local_a8,(kj *)0x4d8ac4,(char (*) [4])pcVar8);
  str<char_const(&)[4]>((String *)local_88,(kj *)0x4aa378,params_00);
  strTree<kj::String,char_const(&)[4],kj::String>
            ((StringTree *)&_kjCondition_4,(kj *)local_a8,(String *)0x4b858f,(char (*) [4])local_88,
             (String *)pcVar12);
  local_8c[0] = '<';
  local_34 = CONCAT31(local_34._1_3_,0x3e);
  concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            ((String *)&stack0xfffffffffffffef8,(_ *)local_8c,
             (FixedArray<char,_1UL> *)&_kjCondition_4,(StringTree *)&stack0xffffffffffffffcc,
             (FixedArray<char,_1UL> *)pcVar12);
  DebugExpression<char_const(&)[12]>::operator==
            ((DebugComparison<const_char_(&)[12],_kj::String> *)&_kjCondition,
             (DebugExpression<char_const(&)[12]> *)&pieceCount,(String *)&stack0xfffffffffffffef8);
  pacVar11 = extraout_RDX_11;
  plVar9 = plVar15;
  if (plVar15 != (longlong *)0x0) {
    plVar9 = (longlong *)0x0;
    pAStack_100 = (ArrayPtr<const_char> *)0x0;
    (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar15,1,pAVar6,pAVar6,0);
    pacVar11 = extraout_RDX_12;
    pcVar12 = (char *)pAVar6;
  }
  pAVar6 = (ArrayPtr<const_char> *)_kjCondition_4.op.content.size_;
  pcVar8 = _kjCondition_4.op.content.ptr;
  if (_kjCondition_4.op.content.ptr != (char *)0x0) {
    _kjCondition_4.op.content.ptr = (char *)0x0;
    _kjCondition_4.op.content.size_ = 0;
    (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
              ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar8,0x40,
               pAVar6,pAVar6,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    pacVar11 = extraout_RDX_13;
    pcVar12 = (char *)pAVar6;
  }
  pAVar6 = (ArrayPtr<const_char> *)_kjCondition_4.right.content.size_;
  pcVar8 = _kjCondition_4.right.content.ptr;
  if (_kjCondition_4.right.content.ptr != (char *)0x0) {
    _kjCondition_4.right.content.ptr = (char *)0x0;
    _kjCondition_4.right.content.size_ = 0;
    (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition_4.right.content.disposer,pcVar8,1,pAVar6,pAVar6,0);
    pacVar11 = extraout_RDX_14;
    pcVar12 = (char *)pAVar6;
  }
  pAVar6 = (ArrayPtr<const_char> *)local_88._8_8_;
  uVar3 = local_88._0_8_;
  if ((Branch *)local_88._0_8_ != (Branch *)0x0) {
    local_88._0_8_ = (Branch *)0x0;
    local_88._8_8_ = (ArrayPtr<const_char> *)0x0;
    (***(_func_int ***)local_88._16_8_)(local_88._16_8_,uVar3,1,pAVar6,pAVar6,0);
    pacVar11 = extraout_RDX_15;
    pcVar12 = (char *)pAVar6;
  }
  pAVar6 = (ArrayPtr<const_char> *)local_a8._8_8_;
  uVar3 = local_a8._0_8_;
  if ((FixedArray<char,_1UL> *)local_a8._0_8_ != (FixedArray<char,_1UL> *)0x0) {
    local_a8._0_8_ = (FixedArray<char,_1UL> *)0x0;
    local_a8._8_8_ = (ArrayPtr<const_char> *)0x0;
    (***(_func_int ***)local_a8._16_8_)(local_a8._16_8_,uVar3,1,pAVar6,pAVar6,0);
    pacVar11 = extraout_RDX_16;
    pcVar12 = (char *)pAVar6;
  }
  if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
    str<char_const(&)[4]>((String *)local_a8,(kj *)0x4d8ac4,pacVar11);
    str<char_const(&)[4]>((String *)local_88,(kj *)0x4aa378,params_01);
    strTree<kj::String,char_const(&)[4],kj::String>
              ((StringTree *)&_kjCondition_4,(kj *)local_a8,(String *)0x4b858f,
               (char (*) [4])local_88,(String *)pcVar12);
    _pieceCount = (char *)CONCAT71(stack0xffffffffffffff51,0x3c);
    local_8c[0] = '>';
    concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
              ((String *)&stack0xfffffffffffffef8,(_ *)&pieceCount,
               (FixedArray<char,_1UL> *)&_kjCondition_4,(StringTree *)local_8c,
               (FixedArray<char,_1UL> *)pcVar12);
    Debug::
    log<char_const(&)[92],kj::_::DebugComparison<char_const(&)[12],kj::String>&,char_const(&)[12],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-tree-test.c++"
               ,0x2c,ERROR,
               "\"failed: expected \" \"(\\\"<foobarbaz>\\\") == (str(\'<\', strTree(str(\\\"foo\\\"), \\\"bar\\\", str(\\\"baz\\\")), \'>\'))\", _kjCondition, \"<foobarbaz>\", str(\'<\', strTree(str(\"foo\"), \"bar\", str(\"baz\")), \'>\')"
               ,(char (*) [92])
                "failed: expected (\"<foobarbaz>\") == (str(\'<\', strTree(str(\"foo\"), \"bar\", str(\"baz\")), \'>\'))"
               ,(DebugComparison<const_char_(&)[12],_kj::String> *)&_kjCondition,
               (char (*) [12])"<foobarbaz>",(String *)&stack0xfffffffffffffef8);
    if (plVar9 != (longlong *)0x0) {
      (**local_f8->_vptr_ArrayDisposer)(local_f8,plVar9,1,pAStack_100,pAStack_100,0);
    }
    sVar2 = _kjCondition_4.op.content.size_;
    pcVar12 = _kjCondition_4.op.content.ptr;
    if (_kjCondition_4.op.content.ptr != (char *)0x0) {
      _kjCondition_4.op.content.ptr = (char *)0x0;
      _kjCondition_4.op.content.size_ = 0;
      (*(code *)**(undefined8 **)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result))
                ((undefined8 *)CONCAT71(_kjCondition_4._49_7_,_kjCondition_4.result),pcVar12,0x40,
                 sVar2,sVar2,ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = _kjCondition_4.right.content.size_;
    pcVar12 = _kjCondition_4.right.content.ptr;
    if (_kjCondition_4.right.content.ptr != (char *)0x0) {
      _kjCondition_4.right.content.ptr = (char *)0x0;
      _kjCondition_4.right.content.size_ = 0;
      (**(_kjCondition_4.right.content.disposer)->_vptr_ArrayDisposer)
                (_kjCondition_4.right.content.disposer,pcVar12,1,sVar2,sVar2,0);
    }
    uVar4 = local_88._8_8_;
    uVar3 = local_88._0_8_;
    if ((Branch *)local_88._0_8_ != (Branch *)0x0) {
      local_88._0_8_ = (Branch *)0x0;
      local_88._8_8_ = (ArrayPtr<const_char> *)0x0;
      (***(_func_int ***)local_88._16_8_)(local_88._16_8_,uVar3,1,uVar4,uVar4,0);
    }
    uVar4 = local_a8._8_8_;
    uVar3 = local_a8._0_8_;
    if ((FixedArray<char,_1UL> *)local_a8._0_8_ != (FixedArray<char,_1UL> *)0x0) {
      local_a8._0_8_ = (FixedArray<char,_1UL> *)0x0;
      local_a8._8_8_ = (ArrayPtr<const_char> *)0x0;
      (***(_func_int ***)local_a8._16_8_)(local_a8._16_8_,uVar3,1,uVar4,uVar4,0);
    }
  }
  sVar2 = _kjCondition.right.content.size_;
  pcVar12 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar12,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

TEST(StringTree, StrTree) {
  EXPECT_EQ("foobar", strTree("foo", "bar").flatten());
  EXPECT_EQ("1 2 3 4", strTree(1, " ", 2u, " ", 3l, " ", 4ll).flatten());
  EXPECT_EQ("1.5 foo 1e15 bar -3", strTree(1.5f, " foo ", 1e15, " bar ", -3).flatten());
  EXPECT_EQ("foo", strTree('f', 'o', 'o').flatten());

  {
    StringTree tree = strTree(strTree(str("foo"), str("bar")), "baz");
    EXPECT_EQ("foobarbaz", tree.flatten());

    uint pieceCount = 0;
    tree.visit([&](ArrayPtr<const char> part) { ++pieceCount; EXPECT_EQ(3u, part.size()); });
    EXPECT_EQ(3u, pieceCount);
  }

  EXPECT_EQ("<foobarbaz>", str('<', strTree(str("foo"), "bar", str("baz")), '>'));
}